

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

int is_reserved(char *name)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  char *pcVar5;
  
  cVar1 = *name;
  if ((cVar1 == '.') && (name[1] == '\0')) {
    iVar4 = 1;
  }
  else {
    iVar2 = strcmp(name,"$accept");
    iVar4 = 1;
    if ((iVar2 != 0) && (iVar2 = strcmp(name,"$end"), iVar2 != 0)) {
      if ((cVar1 == '$') && (name[1] == '$')) {
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)name[2] * 2 + 1) & 8) != 0) {
          pcVar5 = name + 3;
          do {
            cVar1 = *pcVar5;
            pcVar5 = pcVar5 + 1;
          } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) != 0);
          if (cVar1 == '\0') {
            return 1;
          }
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int is_reserved(char *name)
{
    char *s;

    if (strcmp(name, ".") == 0 ||
	strcmp(name, "$accept") == 0 ||
	strcmp(name, "$end") == 0)
	return (1);

    if (name[0] == '$' && name[1] == '$' && isdigit(name[2])) {
	s = name + 3;
	while (isdigit(*s)) ++s;
	if (*s == NUL) return (1); }

    return (0);
}